

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O1

SplitScaleBias *
dxil_spv::split_index_scale_bias(SplitScaleBias *__return_storage_ptr__,Value *value)

{
  ValueKind VVar1;
  BinaryOps BVar2;
  Constant *pCVar3;
  APInt *pAVar4;
  uint64_t uVar5;
  BinaryOperator *this;
  Value *pVVar6;
  Constant *pCVar7;
  uint index;
  Constant *pCVar8;
  BinaryOperator *this_00;
  
  if (value == (Value *)0x0) {
    pCVar8 = (Constant *)0x0;
  }
  else {
    pCVar3 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
    VVar1 = LLVMBC::Value::get_value_kind((Value *)pCVar3);
    pCVar8 = (Constant *)0x0;
    if (VVar1 == ConstantInt) {
      pCVar8 = pCVar3;
    }
  }
  if (pCVar8 != (Constant *)0x0) {
    __return_storage_ptr__->stride = 0xffffffff;
    __return_storage_ptr__->index = (Value *)0x0;
    pAVar4 = LLVMBC::Constant::getUniqueInteger(pCVar8);
    uVar5 = LLVMBC::APInt::getZExtValue(pAVar4);
    __return_storage_ptr__->elem = (uint32_t)uVar5;
    return __return_storage_ptr__;
  }
  if (value == (Value *)0x0) {
    this_00 = (BinaryOperator *)0x0;
  }
  else {
    this = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(value);
    VVar1 = LLVMBC::Value::get_value_kind((Value *)this);
    this_00 = (BinaryOperator *)0x0;
    if (VVar1 == BinaryOperator) {
      this_00 = this;
    }
  }
  if (this_00 != (BinaryOperator *)0x0) {
    BVar2 = LLVMBC::BinaryOperator::getOpcode(this_00);
    if (BVar2 == Add) {
      pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,0);
      pCVar8 = (Constant *)0x0;
      if (pVVar6 != (Value *)0x0) {
        pCVar3 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar6);
        VVar1 = LLVMBC::Value::get_value_kind((Value *)pCVar3);
        pCVar8 = (Constant *)0x0;
        if (VVar1 == ConstantInt) {
          pCVar8 = pCVar3;
        }
      }
      pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,1);
      if (pVVar6 == (Value *)0x0) {
        pCVar3 = (Constant *)0x0;
      }
      else {
        pCVar7 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar6);
        VVar1 = LLVMBC::Value::get_value_kind((Value *)pCVar7);
        pCVar3 = (Constant *)0x0;
        if (VVar1 == ConstantInt) {
          pCVar3 = pCVar7;
        }
      }
      if ((pCVar8 == (Constant *)0x0) || (pCVar3 != (Constant *)0x0)) {
        if ((pCVar8 != (Constant *)0x0) || (pCVar3 == (Constant *)0x0)) goto LAB_0014fd80;
        pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,0);
        split_index_scale_bias(__return_storage_ptr__,pVVar6);
      }
      else {
        pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,1);
        split_index_scale_bias(__return_storage_ptr__,pVVar6);
        pCVar3 = pCVar8;
      }
      pAVar4 = LLVMBC::Constant::getUniqueInteger(pCVar3);
      uVar5 = LLVMBC::APInt::getZExtValue(pAVar4);
      __return_storage_ptr__->elem = __return_storage_ptr__->elem + (int)uVar5;
      return __return_storage_ptr__;
    }
    BVar2 = LLVMBC::BinaryOperator::getOpcode(this_00);
    if (BVar2 == Mul) {
      pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,0);
      pCVar8 = (Constant *)0x0;
      if (pVVar6 != (Value *)0x0) {
        pCVar3 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar6);
        VVar1 = LLVMBC::Value::get_value_kind((Value *)pCVar3);
        pCVar8 = (Constant *)0x0;
        if (VVar1 == ConstantInt) {
          pCVar8 = pCVar3;
        }
      }
      pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,1);
      if (pVVar6 == (Value *)0x0) {
        pCVar3 = (Constant *)0x0;
      }
      else {
        pCVar7 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar6);
        VVar1 = LLVMBC::Value::get_value_kind((Value *)pCVar7);
        pCVar3 = (Constant *)0x0;
        if (VVar1 == ConstantInt) {
          pCVar3 = pCVar7;
        }
      }
      if ((pCVar8 == (Constant *)0x0) || (pCVar3 != (Constant *)0x0)) {
        if ((pCVar8 != (Constant *)0x0) || (pCVar3 == (Constant *)0x0)) goto LAB_0014fd80;
        pAVar4 = LLVMBC::Constant::getUniqueInteger(pCVar3);
        uVar5 = LLVMBC::APInt::getZExtValue(pAVar4);
        __return_storage_ptr__->stride = (uint32_t)uVar5;
        index = 0;
      }
      else {
        pAVar4 = LLVMBC::Constant::getUniqueInteger(pCVar8);
        uVar5 = LLVMBC::APInt::getZExtValue(pAVar4);
        __return_storage_ptr__->stride = (uint32_t)uVar5;
        index = 1;
      }
      pVVar6 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,index);
      __return_storage_ptr__->index = pVVar6;
      __return_storage_ptr__->elem = 0;
      return __return_storage_ptr__;
    }
  }
LAB_0014fd80:
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->index = (Value *)0x0;
  *(undefined8 *)&__return_storage_ptr__->elem = 0;
  return __return_storage_ptr__;
}

Assistant:

SplitScaleBias split_index_scale_bias(const llvm::Value *value)
{
	const auto *cint = llvm::dyn_cast<llvm::ConstantInt>(value);
	// Return UINT32_MAX as stride since we cannot reasonably know yet.
	if (cint)
		return { UINT32_MAX, nullptr, uint32_t(cint->getUniqueInteger().getZExtValue()) };

	const auto *binop = llvm::dyn_cast<llvm::BinaryOperator>(value);
	if (!binop)
		return {};

	if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add)
	{
		const auto *const0 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(0));
		const auto *const1 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(1));
		if (const0 && !const1)
		{
			auto split = split_index_scale_bias(binop->getOperand(1));
			split.elem += const0->getUniqueInteger().getZExtValue();
			return split;
		}
		else if (!const0 && const1)
		{
			auto split = split_index_scale_bias(binop->getOperand(0));
			split.elem += const1->getUniqueInteger().getZExtValue();
			return split;
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Mul)
	{
		const auto *const0 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(0));
		const auto *const1 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(1));
		if (const0 && !const1)
			return { uint32_t(const0->getUniqueInteger().getZExtValue()), binop->getOperand(1), 0 };
		else if (!const0 && const1)
			return { uint32_t(const1->getUniqueInteger().getZExtValue()), binop->getOperand(0), 0 };
	}

	return {};
}